

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

vector<duckdb::SecretType,_true> * __thiscall
duckdb::SecretManager::AllSecretTypes
          (vector<duckdb::SecretType,_true> *__return_storage_ptr__,SecretManager *this)

{
  __node_base *p_Var1;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  ::std::unique_lock<std::mutex>::unique_lock(&local_20,&this->manager_lock);
  (__return_storage_ptr__->super_vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>).
  super__Vector_base<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>).
  super__Vector_base<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>).
  super__Vector_base<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->secret_types)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ::std::vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>::push_back
              (&__return_storage_ptr__->
                super_vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>,
               (value_type *)(p_Var1 + 5));
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return __return_storage_ptr__;
}

Assistant:

vector<SecretType> SecretManager::AllSecretTypes() {
	unique_lock<mutex> lck(manager_lock);
	vector<SecretType> result;

	for (const auto &secret : secret_types) {
		result.push_back(secret.second);
	}

	return result;
}